

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O2

Query * q_optimize(Query *__return_storage_ptr__,Query *q)

{
  byte bVar1;
  QueryType *pQVar2;
  bool local_69;
  Query local_68;
  
  pQVar2 = Query::get_type(q);
  if (*pQVar2 != PRIMITIVE) {
    simplify_subqueries(&local_68,q);
    Query::operator=(q,&local_68);
    Query::~Query(&local_68);
    bVar1 = 1;
    while ((bVar1 & 1) != 0) {
      local_69 = false;
      flatten_trivial_operations(&local_68,q,&local_69);
      Query::operator=(q,&local_68);
      Query::~Query(&local_68);
      inline_suboperations(&local_68,q,&local_69);
      Query::operator=(q,&local_68);
      Query::~Query(&local_68);
      deduplicate_primitives(&local_68,q,&local_69);
      Query::operator=(q,&local_68);
      Query::~Query(&local_68);
      simplify_minof(&local_68,q,&local_69);
      Query::operator=(q,&local_68);
      Query::~Query(&local_68);
      propagate_degenerate_queries(&local_68,q,&local_69);
      Query::operator=(q,&local_68);
      Query::~Query(&local_68);
      bVar1 = local_69;
    }
    reorder_subqueries(&local_68,q);
    Query::operator=(q,&local_68);
    Query::~Query(&local_68);
  }
  Query::Query(__return_storage_ptr__,q);
  return __return_storage_ptr__;
}

Assistant:

Query q_optimize(Query &&q) {
    if (q.get_type() == QueryType::PRIMITIVE) {
        // Nothing to improve here.
        return std::move(q);
    }

    q = simplify_subqueries(std::move(q));
    bool changed = true;
    while (changed) {
        changed = false;
        q = flatten_trivial_operations(std::move(q), &changed);
        q = inline_suboperations(std::move(q), &changed);
        q = deduplicate_primitives(std::move(q), &changed);
        q = simplify_minof(std::move(q), &changed);
        q = propagate_degenerate_queries(std::move(q), &changed);
    }
    q = reorder_subqueries(std::move(q));
    return std::move(q);
}